

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

string * __thiscall
LiteScript::_Type_CHARACTER::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_CHARACTER *this,Variable *obj)

{
  char32_t c;
  Object *pOVar1;
  String local_30;
  
  pOVar1 = Variable::operator->(obj);
  c = Character::operator_cast_to_char32_t((Character *)pOVar1->data);
  String::String(&local_30,c);
  String::operator_cast_to_string(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_30.str._M_dataplus._M_p != &local_30.str.field_2) {
    operator_delete(local_30.str._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_CHARACTER::ToString(const LiteScript::Variable& obj) const {
    return String(obj->GetData<Character>());
}